

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_3x3_nonnumeric::test_method(test_solvers_3x3_nonnumeric *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8;
  undefined4 local_1bc;
  duration<long,_boost::ratio<1L,_1L>_> local_1b8;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  local_1b0;
  unsigned_long local_188;
  size_t expected_assignment [3];
  duration<long,_boost::ratio<1L,_1L>_> local_148;
  seconds costs [9];
  test_solvers_3x3_nonnumeric *this_local;
  
  local_148.rep_ = 1;
  costs[0].rep_ = 2;
  costs[1].rep_ = 4;
  costs[2].rep_ = 0;
  costs[3].rep_ = 2;
  costs[4].rep_ = -1;
  costs[5].rep_ = 3;
  costs[6].rep_ = 0;
  expected_assignment[2]._4_4_ = 0xfffffffd;
  costs[7].rep_ = -3;
  local_188 = 1;
  expected_assignment[0] = 0;
  expected_assignment[1] = 2;
  costs[8].rep_ = (rep)this;
  make_matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>>(&local_1b0,&local_148,3,3);
  local_1bc = 0xffffffff;
  local_1b8.rep_ = -1;
  make_vector<unsigned_long>(&local_1e8,&local_188,3);
  assert_solvers_result<boost::chrono::duration<long,boost::ratio<1l,1l>>>
            (&local_1b0,local_1b8,&local_1e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1e8);
  boost::numeric::ublas::
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  ::~matrix(&local_1b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3_nonnumeric)
{
  using boost::chrono::seconds;
  const seconds costs[] = {seconds(1), seconds(2), seconds(4),
                           seconds(0), seconds(2), seconds(-1),
                           seconds(3), seconds(0), seconds(-3)};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), seconds(-1), make_vector(expected_assignment, 3));
}